

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O3

void __thiscall
chrono::ChCoordsys<double>::ArchiveOUT(ChCoordsys<double> *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChQuaternion<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChCoordsys<double>>(marchive);
  local_38._name = "pos";
  local_38._flags = '\0';
  local_38._value = (ChQuaternion<double> *)this;
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)&local_38);
  local_38._value = &this->rot;
  local_38._name = "rot";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChQuaternion<double>>(marchive,&local_38);
  return;
}

Assistant:

void ArchiveOUT(ChArchiveOut& marchive) {
        // suggested: use versioning
        marchive.VersionWrite<ChCoordsys<double>>();
        // stream out all member data
        marchive << CHNVP(pos);
        marchive << CHNVP(rot);
    }